

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nvector.c
# Opt level: O3

int Test_N_VWrmsNorm(N_Vector X,N_Vector W,sunindextype param_3,int myid)

{
  realtype rVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  double dVar5;
  timespec spec;
  timespec local_30;
  
  N_VConst(-0.5,X);
  N_VConst(0.5,W);
  clock_gettime(4,&local_30);
  lVar2 = local_30.tv_sec - base_time_tv_sec;
  dVar5 = (double)local_30.tv_nsec;
  rVar1 = N_VWrmsNorm(X,W);
  sync_device();
  clock_gettime(4,&local_30);
  lVar3 = local_30.tv_sec - base_time_tv_sec;
  if ((rVar1 < 0.0) || (1e-15 < ABS(rVar1 + -0.25) * 4.0)) {
    printf(">>> FAILED test -- N_VWrmsNorm, Proc %d \n",(ulong)(uint)myid);
    iVar4 = 1;
  }
  else {
    iVar4 = 0;
    if (myid == 0) {
      puts("PASSED test -- N_VWrmsNorm ");
      iVar4 = 0;
    }
  }
  dVar5 = max_time(X,((double)local_30.tv_nsec / 1000000000.0 + (double)lVar3) -
                     (dVar5 / 1000000000.0 + (double)lVar2));
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n",SUB84(dVar5,0),"N_VWrmsNorm");
  }
  return iVar4;
}

Assistant:

int Test_N_VWrmsNorm(N_Vector X, N_Vector W, sunindextype local_length, int myid)
{
  int      fails = 0, failure = 0;
  double   start_time, stop_time, maxt;
  realtype ans;

  /* fill vector data */
  N_VConst(NEG_HALF, X);
  N_VConst(HALF, W);

  start_time = get_time();
  ans = N_VWrmsNorm(X, W);
  sync_device();
  stop_time = get_time();

  /* ans should equal 1/4 */
  failure = (ans < ZERO) ? 1 : FNEQ(ans, HALF*HALF);

  if (failure) {
    printf(">>> FAILED test -- N_VWrmsNorm, Proc %d \n", myid);
    fails++;
  } else if (myid == 0) {
    printf("PASSED test -- N_VWrmsNorm \n");
  }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VWrmsNorm", maxt);

  return(fails);
}